

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O3

void plan(void)

{
  float fVar1;
  double dVar2;
  uint uVar3;
  int iVar4;
  cursor_res cVar5;
  long lVar6;
  size_t req_buf_size;
  size_t buflen;
  uint8_t val;
  cursor_wtr wtr;
  char err_msg [64];
  undefined8 local_b0;
  cursor_rdr local_a8;
  cursor_wtr local_90;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  
  iVar4 = greatest_pre_test("roundtrip_plan_shoud_match");
  if (iVar4 == 0) {
    if ((greatest_info.flags & 2) != 0) {
      fprintf(_stdout,"  %s\n","roundtrip_plan_shoud_match");
    }
  }
  else {
    iVar4 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar4 == 0) {
      lVar6 = 0x18;
      buflen = 0;
      do {
        random_instruction();
        *(undefined8 *)((long)greatest_info.jump_dest[0].__saved_mask.__val + lVar6 + 0x78) =
             local_68;
        *(undefined8 *)((long)&is[0].it + lVar6) = uStack_60;
        *(undefined8 *)((long)greatest_info.jump_dest[0].__saved_mask.__val + lVar6 + 0x68) =
             local_78;
        *(undefined8 *)((long)greatest_info.jump_dest[0].__saved_mask.__val + lVar6 + 0x70) =
             uStack_70;
        buflen = buflen + *(long *)((long)&is[0].it + lVar6);
        lVar6 = lVar6 + 0x20;
      } while (lVar6 != 0x30d418);
      cursor_wtr_new(&local_90,test_buf,buflen);
      lVar6 = 0;
      uVar3 = greatest_info.assertions;
      do {
        greatest_info.assertions = uVar3;
        cVar5 = cursor_pack_instr(&local_90,(instruction *)((long)&is[0].it + lVar6));
        if (cVar5 != cursor_res_ok) {
          greatest_info.assertions = greatest_info.assertions + 1;
          fwrite("\nExpected: ",0xb,1,_stdout);
          fprintf(_stdout,"%d",0);
          fwrite("\n     Got: ",0xb,1,_stdout);
          fprintf(_stdout,"%d",(ulong)cVar5);
          fputc(10,_stdout);
          greatest_info.fail_line = 0x2fd;
          greatest_info.msg = "cursor_pack_le returned an error";
          goto LAB_001065cc;
        }
        lVar6 = lVar6 + 0x20;
        uVar3 = greatest_info.assertions + 1;
      } while (lVar6 != 3200000);
      greatest_info.assertions = greatest_info.assertions + 2;
      if (local_90.state.pos == local_90.state.len) {
        cursor_rdr_new(&local_a8,test_buf,buflen);
        lVar6 = 0x10;
        do {
          iVar4 = *(int *)((long)&is[0].it + lVar6);
          if (iVar4 == 0) {
            snprintf((char *)&local_78,0x40,"Unpack value does not match at position %zd",
                     local_a8.state.pos);
            switch(*(undefined4 *)
                    ((long)greatest_info.jump_dest[0].__saved_mask.__val + lVar6 + 0x70)) {
            case 0:
              cVar5 = cursor_unpack_be_u8(&local_a8,(uint8_t *)&local_b0);
              greatest_info.assertions = greatest_info.assertions + 1;
              if (*(byte *)((long)greatest_info.jump_dest[0].__saved_mask.__val + lVar6 + 0x78) ==
                  (byte)local_b0) {
LAB_001062a8:
                greatest_info.assertions = greatest_info.assertions + 1;
                if (cVar5 != cursor_res_ok) {
                  greatest_info.fail_line = 0x175;
                  goto LAB_001062d0;
                }
                goto LAB_001062e3;
              }
              fwrite("\nExpected: ",0xb,1,_stdout);
              fprintf(_stdout,"%u",
                      (ulong)*(byte *)((long)greatest_info.jump_dest[0].__saved_mask.__val +
                                      lVar6 + 0x78));
              fwrite("\n     Got: ",0xb,1,_stdout);
              fprintf(_stdout,"%u",(ulong)(byte)local_b0);
              fputc(10,_stdout);
              greatest_info.fail_line = 0x144;
              greatest_info.msg = (char *)&local_78;
              break;
            case 1:
              cVar5 = cursor_unpack_be_i8(&local_a8,(int8_t *)&local_b0);
              greatest_info.assertions = greatest_info.assertions + 1;
              if (*(byte *)((long)greatest_info.jump_dest[0].__saved_mask.__val + lVar6 + 0x78) ==
                  (byte)local_b0) goto LAB_001062a8;
              fwrite("\nExpected: ",0xb,1,_stdout);
              fprintf(_stdout,"%d",
                      (ulong)(uint)(int)*(char *)((long)greatest_info.jump_dest[0].__saved_mask.
                                                        __val + lVar6 + 0x78));
              fwrite("\n     Got: ",0xb,1,_stdout);
              fprintf(_stdout,"%d",(ulong)(uint)(int)(char)(byte)local_b0);
              fputc(10,_stdout);
              greatest_info.fail_line = 0x149;
              greatest_info.msg = (char *)&local_78;
              break;
            case 2:
              cVar5 = cursor_unpack_be_u16(&local_a8,(uint16_t *)&local_b0);
              greatest_info.assertions = greatest_info.assertions + 1;
              if (*(short *)((long)greatest_info.jump_dest[0].__saved_mask.__val + lVar6 + 0x78) ==
                  CONCAT11(local_b0._1_1_,(byte)local_b0)) goto LAB_001062a8;
              fwrite("\nExpected: ",0xb,1,_stdout);
              fprintf(_stdout,"%d",
                      (ulong)*(ushort *)
                              ((long)greatest_info.jump_dest[0].__saved_mask.__val + lVar6 + 0x78));
              fwrite("\n     Got: ",0xb,1,_stdout);
              fprintf(_stdout,"%d",(ulong)CONCAT11(local_b0._1_1_,(byte)local_b0));
              fputc(10,_stdout);
              greatest_info.fail_line = 0x14f;
              greatest_info.msg = (char *)&local_78;
              break;
            case 3:
              cVar5 = cursor_unpack_be_i16(&local_a8,(int16_t *)&local_b0);
              greatest_info.assertions = greatest_info.assertions + 1;
              if (*(short *)((long)greatest_info.jump_dest[0].__saved_mask.__val + lVar6 + 0x78) ==
                  CONCAT11(local_b0._1_1_,(byte)local_b0)) goto LAB_001062a8;
              fwrite("\nExpected: ",0xb,1,_stdout);
              fprintf(_stdout,"%d",
                      (ulong)(uint)(int)*(short *)((long)greatest_info.jump_dest[0].__saved_mask.
                                                         __val + lVar6 + 0x78));
              fwrite("\n     Got: ",0xb,1,_stdout);
              fprintf(_stdout,"%d",(ulong)(uint)(int)CONCAT11(local_b0._1_1_,(byte)local_b0));
              fputc(10,_stdout);
              greatest_info.fail_line = 0x154;
              greatest_info.msg = (char *)&local_78;
              break;
            case 4:
              cVar5 = cursor_unpack_be_u32(&local_a8,(uint32_t *)&local_b0);
              greatest_info.assertions = greatest_info.assertions + 1;
              if (*(int *)((long)greatest_info.jump_dest[0].__saved_mask.__val + lVar6 + 0x78) ==
                  CONCAT22(local_b0._2_2_,CONCAT11(local_b0._1_1_,(byte)local_b0)))
              goto LAB_001062a8;
              fwrite("\nExpected: ",0xb,1,_stdout);
              fprintf(_stdout,"%u",
                      (ulong)*(uint *)((long)greatest_info.jump_dest[0].__saved_mask.__val +
                                      lVar6 + 0x78));
              fwrite("\n     Got: ",0xb,1,_stdout);
              fprintf(_stdout,"%u",
                      (ulong)CONCAT22(local_b0._2_2_,CONCAT11(local_b0._1_1_,(byte)local_b0)));
              fputc(10,_stdout);
              greatest_info.fail_line = 0x159;
              greatest_info.msg = (char *)&local_78;
              break;
            case 5:
              cVar5 = cursor_unpack_be_i32(&local_a8,(int32_t *)&local_b0);
              greatest_info.assertions = greatest_info.assertions + 1;
              if (*(int *)((long)greatest_info.jump_dest[0].__saved_mask.__val + lVar6 + 0x78) ==
                  CONCAT22(local_b0._2_2_,CONCAT11(local_b0._1_1_,(byte)local_b0)))
              goto LAB_001062a8;
              fwrite("\nExpected: ",0xb,1,_stdout);
              fprintf(_stdout,"%d",
                      (ulong)*(uint *)((long)greatest_info.jump_dest[0].__saved_mask.__val +
                                      lVar6 + 0x78));
              fwrite("\n     Got: ",0xb,1,_stdout);
              fprintf(_stdout,"%d",
                      (ulong)CONCAT22(local_b0._2_2_,CONCAT11(local_b0._1_1_,(byte)local_b0)));
              fputc(10,_stdout);
              greatest_info.fail_line = 0x15e;
LAB_00106145:
              greatest_info.msg = "instr->val.i32 != val";
              break;
            case 6:
              cVar5 = cursor_unpack_be_u64(&local_a8,&local_b0);
              greatest_info.assertions = greatest_info.assertions + 1;
              if (*(long *)((long)greatest_info.jump_dest[0].__saved_mask.__val + lVar6 + 0x78) ==
                  CONCAT44(local_b0._4_4_,
                           CONCAT22(local_b0._2_2_,CONCAT11(local_b0._1_1_,(byte)local_b0))))
              goto LAB_001062a8;
              fwrite("\nExpected: ",0xb,1,_stdout);
              fprintf(_stdout,"%lu",
                      *(undefined8 *)
                       ((long)greatest_info.jump_dest[0].__saved_mask.__val + lVar6 + 0x78));
              fwrite("\n     Got: ",0xb,1,_stdout);
              fprintf(_stdout,"%lu",
                      CONCAT44(local_b0._4_4_,
                               CONCAT22(local_b0._2_2_,CONCAT11(local_b0._1_1_,(byte)local_b0))));
              fputc(10,_stdout);
              greatest_info.fail_line = 0x163;
              greatest_info.msg = (char *)&local_78;
              break;
            case 7:
              cVar5 = cursor_unpack_be_i64(&local_a8,&local_b0);
              greatest_info.assertions = greatest_info.assertions + 1;
              if (*(long *)((long)greatest_info.jump_dest[0].__saved_mask.__val + lVar6 + 0x78) ==
                  CONCAT44(local_b0._4_4_,
                           CONCAT22(local_b0._2_2_,CONCAT11(local_b0._1_1_,(byte)local_b0))))
              goto LAB_001062a8;
              fwrite("\nExpected: ",0xb,1,_stdout);
              fprintf(_stdout,"%ld",
                      *(undefined8 *)
                       ((long)greatest_info.jump_dest[0].__saved_mask.__val + lVar6 + 0x78));
              fwrite("\n     Got: ",0xb,1,_stdout);
              fprintf(_stdout,"%ld",
                      CONCAT44(local_b0._4_4_,
                               CONCAT22(local_b0._2_2_,CONCAT11(local_b0._1_1_,(byte)local_b0))));
              fputc(10,_stdout);
              greatest_info.fail_line = 0x168;
              greatest_info.msg = (char *)&local_78;
              break;
            case 8:
              cVar5 = cursor_unpack_be_f(&local_a8,(float *)&local_b0);
              greatest_info.assertions = greatest_info.assertions + 1;
              fVar1 = *(float *)((long)greatest_info.jump_dest[0].__saved_mask.__val + lVar6 + 0x78)
              ;
              if ((fVar1 == (float)CONCAT22(local_b0._2_2_,CONCAT11(local_b0._1_1_,(byte)local_b0)))
                 && (!NAN(fVar1) &&
                     !NAN((float)CONCAT22(local_b0._2_2_,CONCAT11(local_b0._1_1_,(byte)local_b0)))))
              goto LAB_001062a8;
              fwrite("\nExpected: ",0xb,1,_stdout);
              fprintf(_stdout,"%f",
                      SUB84((double)*(float *)((long)greatest_info.jump_dest[0].__saved_mask.__val +
                                              lVar6 + 0x78),0));
              fwrite("\n     Got: ",0xb,1,_stdout);
              fprintf(_stdout,"%f",
                      SUB84((double)(float)CONCAT22(local_b0._2_2_,
                                                    CONCAT11(local_b0._1_1_,(byte)local_b0)),0));
              fputc(10,_stdout);
              greatest_info.fail_line = 0x16d;
              greatest_info.msg = (char *)&local_78;
              break;
            case 9:
              cVar5 = cursor_unpack_be_d(&local_a8,(double *)&local_b0);
              greatest_info.assertions = greatest_info.assertions + 1;
              dVar2 = *(double *)
                       ((long)greatest_info.jump_dest[0].__saved_mask.__val + lVar6 + 0x78);
              if ((dVar2 == (double)CONCAT44(local_b0._4_4_,
                                             CONCAT22(local_b0._2_2_,
                                                      CONCAT11(local_b0._1_1_,(byte)local_b0)))) &&
                 (!NAN(dVar2) &&
                  !NAN((double)CONCAT44(local_b0._4_4_,
                                        CONCAT22(local_b0._2_2_,
                                                 CONCAT11(local_b0._1_1_,(byte)local_b0))))))
              goto LAB_001062a8;
              fwrite("\nExpected: ",0xb,1,_stdout);
              fprintf(_stdout,"%f",
                      (int)*(undefined8 *)
                            ((long)greatest_info.jump_dest[0].__saved_mask.__val + lVar6 + 0x78));
              fwrite("\n     Got: ",0xb,1,_stdout);
              fprintf(_stdout,"%f",CONCAT22(local_b0._2_2_,CONCAT11(local_b0._1_1_,(byte)local_b0)))
              ;
              fputc(10,_stdout);
              greatest_info.fail_line = 0x172;
              greatest_info.msg = (char *)&local_78;
              break;
            default:
switchD_00105430_default:
              greatest_info.assertions = greatest_info.assertions + 1;
LAB_001062e3:
              greatest_info.msg = (char *)0x0;
              cursor_unpack_and_compare_to_instr_res = 0;
              goto LAB_00106436;
            }
LAB_0010642b:
            greatest_info.fail_file =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/JayKickliter[P]cursor/tests/test.c"
            ;
            cursor_unpack_and_compare_to_instr_res = -1;
          }
          else if (iVar4 == 1) {
            snprintf((char *)&local_78,0x40,"Unpack value does not match at position %zd",
                     local_a8.state.pos);
            switch(*(undefined4 *)
                    ((long)greatest_info.jump_dest[0].__saved_mask.__val + lVar6 + 0x70)) {
            case 0:
              cVar5 = cursor_unpack_le_u8(&local_a8,(uint8_t *)&local_b0);
              greatest_info.assertions = greatest_info.assertions + 1;
              if (*(byte *)((long)greatest_info.jump_dest[0].__saved_mask.__val + lVar6 + 0x78) !=
                  (byte)local_b0) {
                fwrite("\nExpected: ",0xb,1,_stdout);
                fprintf(_stdout,"%u",
                        (ulong)*(byte *)((long)greatest_info.jump_dest[0].__saved_mask.__val +
                                        lVar6 + 0x78));
                fwrite("\n     Got: ",0xb,1,_stdout);
                fprintf(_stdout,"%u",(ulong)(byte)local_b0);
                fputc(10,_stdout);
                greatest_info.fail_line = 0x102;
                greatest_info.msg = (char *)&local_78;
                goto LAB_0010642b;
              }
              break;
            case 1:
              cVar5 = cursor_unpack_le_i8(&local_a8,(int8_t *)&local_b0);
              greatest_info.assertions = greatest_info.assertions + 1;
              if (*(byte *)((long)greatest_info.jump_dest[0].__saved_mask.__val + lVar6 + 0x78) !=
                  (byte)local_b0) {
                fwrite("\nExpected: ",0xb,1,_stdout);
                fprintf(_stdout,"%d",
                        (ulong)(uint)(int)*(char *)((long)greatest_info.jump_dest[0].__saved_mask.
                                                          __val + lVar6 + 0x78));
                fwrite("\n     Got: ",0xb,1,_stdout);
                fprintf(_stdout,"%d",(ulong)(uint)(int)(char)(byte)local_b0);
                fputc(10,_stdout);
                greatest_info.fail_line = 0x107;
                greatest_info.msg = (char *)&local_78;
                goto LAB_0010642b;
              }
              break;
            case 2:
              cVar5 = cursor_unpack_le_u16(&local_a8,(uint16_t *)&local_b0);
              greatest_info.assertions = greatest_info.assertions + 1;
              if (*(short *)((long)greatest_info.jump_dest[0].__saved_mask.__val + lVar6 + 0x78) !=
                  CONCAT11(local_b0._1_1_,(byte)local_b0)) {
                fwrite("\nExpected: ",0xb,1,_stdout);
                fprintf(_stdout,"%d",
                        (ulong)*(ushort *)
                                ((long)greatest_info.jump_dest[0].__saved_mask.__val + lVar6 + 0x78)
                       );
                fwrite("\n     Got: ",0xb,1,_stdout);
                fprintf(_stdout,"%d",(ulong)CONCAT11(local_b0._1_1_,(byte)local_b0));
                fputc(10,_stdout);
                greatest_info.fail_line = 0x10d;
                greatest_info.msg = (char *)&local_78;
                goto LAB_0010642b;
              }
              break;
            case 3:
              cVar5 = cursor_unpack_le_i16(&local_a8,(int16_t *)&local_b0);
              greatest_info.assertions = greatest_info.assertions + 1;
              if (*(short *)((long)greatest_info.jump_dest[0].__saved_mask.__val + lVar6 + 0x78) !=
                  CONCAT11(local_b0._1_1_,(byte)local_b0)) {
                fwrite("\nExpected: ",0xb,1,_stdout);
                fprintf(_stdout,"%d",
                        (ulong)(uint)(int)*(short *)((long)greatest_info.jump_dest[0].__saved_mask.
                                                           __val + lVar6 + 0x78));
                fwrite("\n     Got: ",0xb,1,_stdout);
                fprintf(_stdout,"%d",(ulong)(uint)(int)CONCAT11(local_b0._1_1_,(byte)local_b0));
                fputc(10,_stdout);
                greatest_info.fail_line = 0x112;
                greatest_info.msg = (char *)&local_78;
                goto LAB_0010642b;
              }
              break;
            case 4:
              cVar5 = cursor_unpack_le_u32(&local_a8,(uint32_t *)&local_b0);
              greatest_info.assertions = greatest_info.assertions + 1;
              if (*(int *)((long)greatest_info.jump_dest[0].__saved_mask.__val + lVar6 + 0x78) !=
                  CONCAT22(local_b0._2_2_,CONCAT11(local_b0._1_1_,(byte)local_b0))) {
                fwrite("\nExpected: ",0xb,1,_stdout);
                fprintf(_stdout,"%u",
                        (ulong)*(uint *)((long)greatest_info.jump_dest[0].__saved_mask.__val +
                                        lVar6 + 0x78));
                fwrite("\n     Got: ",0xb,1,_stdout);
                fprintf(_stdout,"%u",
                        (ulong)CONCAT22(local_b0._2_2_,CONCAT11(local_b0._1_1_,(byte)local_b0)));
                fputc(10,_stdout);
                greatest_info.fail_line = 0x117;
                greatest_info.msg = (char *)&local_78;
                goto LAB_0010642b;
              }
              break;
            case 5:
              cVar5 = cursor_unpack_le_i32(&local_a8,(int32_t *)&local_b0);
              greatest_info.assertions = greatest_info.assertions + 1;
              if (*(int *)((long)greatest_info.jump_dest[0].__saved_mask.__val + lVar6 + 0x78) !=
                  CONCAT22(local_b0._2_2_,CONCAT11(local_b0._1_1_,(byte)local_b0))) {
                fwrite("\nExpected: ",0xb,1,_stdout);
                fprintf(_stdout,"%d",
                        (ulong)*(uint *)((long)greatest_info.jump_dest[0].__saved_mask.__val +
                                        lVar6 + 0x78));
                fwrite("\n     Got: ",0xb,1,_stdout);
                fprintf(_stdout,"%d",
                        (ulong)CONCAT22(local_b0._2_2_,CONCAT11(local_b0._1_1_,(byte)local_b0)));
                fputc(10,_stdout);
                greatest_info.fail_line = 0x11c;
                goto LAB_00106145;
              }
              break;
            case 6:
              cVar5 = cursor_unpack_le_u64(&local_a8,&local_b0);
              greatest_info.assertions = greatest_info.assertions + 1;
              if (*(long *)((long)greatest_info.jump_dest[0].__saved_mask.__val + lVar6 + 0x78) !=
                  CONCAT44(local_b0._4_4_,
                           CONCAT22(local_b0._2_2_,CONCAT11(local_b0._1_1_,(byte)local_b0)))) {
                fwrite("\nExpected: ",0xb,1,_stdout);
                fprintf(_stdout,"%lu",
                        *(undefined8 *)
                         ((long)greatest_info.jump_dest[0].__saved_mask.__val + lVar6 + 0x78));
                fwrite("\n     Got: ",0xb,1,_stdout);
                fprintf(_stdout,"%lu",
                        CONCAT44(local_b0._4_4_,
                                 CONCAT22(local_b0._2_2_,CONCAT11(local_b0._1_1_,(byte)local_b0))));
                fputc(10,_stdout);
                greatest_info.fail_line = 0x121;
                greatest_info.msg = (char *)&local_78;
                goto LAB_0010642b;
              }
              break;
            case 7:
              cVar5 = cursor_unpack_le_i64(&local_a8,&local_b0);
              greatest_info.assertions = greatest_info.assertions + 1;
              if (*(long *)((long)greatest_info.jump_dest[0].__saved_mask.__val + lVar6 + 0x78) !=
                  CONCAT44(local_b0._4_4_,
                           CONCAT22(local_b0._2_2_,CONCAT11(local_b0._1_1_,(byte)local_b0)))) {
                fwrite("\nExpected: ",0xb,1,_stdout);
                fprintf(_stdout,"%ld",
                        *(undefined8 *)
                         ((long)greatest_info.jump_dest[0].__saved_mask.__val + lVar6 + 0x78));
                fwrite("\n     Got: ",0xb,1,_stdout);
                fprintf(_stdout,"%ld",
                        CONCAT44(local_b0._4_4_,
                                 CONCAT22(local_b0._2_2_,CONCAT11(local_b0._1_1_,(byte)local_b0))));
                fputc(10,_stdout);
                greatest_info.fail_line = 0x126;
                greatest_info.msg = (char *)&local_78;
                goto LAB_0010642b;
              }
              break;
            case 8:
              cVar5 = cursor_unpack_le_f(&local_a8,(float *)&local_b0);
              greatest_info.assertions = greatest_info.assertions + 1;
              fVar1 = *(float *)((long)greatest_info.jump_dest[0].__saved_mask.__val + lVar6 + 0x78)
              ;
              if ((fVar1 != (float)CONCAT22(local_b0._2_2_,CONCAT11(local_b0._1_1_,(byte)local_b0)))
                 || (NAN(fVar1) ||
                     NAN((float)CONCAT22(local_b0._2_2_,CONCAT11(local_b0._1_1_,(byte)local_b0)))))
              {
                fwrite("\nExpected: ",0xb,1,_stdout);
                fprintf(_stdout,"%f",
                        SUB84((double)*(float *)((long)greatest_info.jump_dest[0].__saved_mask.__val
                                                + lVar6 + 0x78),0));
                fwrite("\n     Got: ",0xb,1,_stdout);
                fprintf(_stdout,"%f",
                        SUB84((double)(float)CONCAT22(local_b0._2_2_,
                                                      CONCAT11(local_b0._1_1_,(byte)local_b0)),0));
                fputc(10,_stdout);
                greatest_info.fail_line = 299;
                greatest_info.msg = (char *)&local_78;
                goto LAB_0010642b;
              }
              break;
            case 9:
              cVar5 = cursor_unpack_le_d(&local_a8,(double *)&local_b0);
              greatest_info.assertions = greatest_info.assertions + 1;
              dVar2 = *(double *)
                       ((long)greatest_info.jump_dest[0].__saved_mask.__val + lVar6 + 0x78);
              if ((dVar2 != (double)CONCAT44(local_b0._4_4_,
                                             CONCAT22(local_b0._2_2_,
                                                      CONCAT11(local_b0._1_1_,(byte)local_b0)))) ||
                 (NAN(dVar2) ||
                  NAN((double)CONCAT44(local_b0._4_4_,
                                       CONCAT22(local_b0._2_2_,
                                                CONCAT11(local_b0._1_1_,(byte)local_b0)))))) {
                fwrite("\nExpected: ",0xb,1,_stdout);
                fprintf(_stdout,"%f",
                        (int)*(undefined8 *)
                              ((long)greatest_info.jump_dest[0].__saved_mask.__val + lVar6 + 0x78));
                fwrite("\n     Got: ",0xb,1,_stdout);
                fprintf(_stdout,"%f",
                        CONCAT22(local_b0._2_2_,CONCAT11(local_b0._1_1_,(byte)local_b0)));
                fputc(10,_stdout);
                greatest_info.fail_line = 0x130;
                greatest_info.msg = (char *)&local_78;
                goto LAB_0010642b;
              }
              break;
            default:
              goto switchD_00105430_default;
            }
            greatest_info.assertions = greatest_info.assertions + 1;
            if (cVar5 == cursor_res_ok) goto LAB_001062e3;
            greatest_info.fail_line = 0x133;
LAB_001062d0:
            greatest_info.msg = "cursor_res_ok != res";
            goto LAB_0010642b;
          }
LAB_00106436:
          iVar4 = cursor_unpack_and_compare_to_instr_res;
          if (cursor_unpack_and_compare_to_instr_res != 0) goto LAB_001065da;
          lVar6 = lVar6 + 0x20;
        } while (lVar6 != 0x30d410);
        greatest_info.msg = (char *)0x0;
      }
      else {
        fwrite("\nExpected: ",0xb,1,_stdout);
        fprintf(_stdout,"%d",local_90.state.pos);
        fwrite("\n     Got: ",0xb,1,_stdout);
        fprintf(_stdout,"%d",local_90.state.len);
        fputc(10,_stdout);
        greatest_info.fail_line = 0x302;
        greatest_info.msg = "Position and len do not match";
LAB_001065cc:
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/JayKickliter[P]cursor/tests/test.c"
        ;
        iVar4 = -1;
      }
    }
LAB_001065da:
    greatest_post_test("roundtrip_plan_shoud_match",iVar4);
  }
  return;
}

Assistant:

SUITE(plan) {
    RUN_TEST(roundtrip_plan_shoud_match);
}